

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintTopLevelExtensions(Generator *this)

{
  long lVar1;
  Printer *this_00;
  int i;
  long lVar2;
  long local_80;
  string local_70;
  string constant_name;
  
  local_80 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(this->file_ + 0x88); lVar2 = lVar2 + 1) {
    lVar1 = *(long *)(this->file_ + 0x98);
    std::operator+(&constant_name,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar1 + local_80),"_FIELD_NUMBER");
    UpperString(&constant_name);
    this_00 = this->printer_;
    SimpleItoa_abi_cxx11_(&local_70,(protobuf *)(ulong)*(uint *)(lVar1 + 0x38 + local_80),i);
    io::Printer::Print(this_00,"$constant_name$ = $number$\n","constant_name",&constant_name,
                       "number",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    io::Printer::Print(this->printer_,"$name$ = ","name",*(string **)(lVar1 + local_80));
    PrintFieldDescriptor(this,(FieldDescriptor *)(lVar1 + local_80),true);
    io::Printer::Print(this->printer_,"\n");
    std::__cxx11::string::~string((string *)&constant_name);
    local_80 = local_80 + 0xa8;
  }
  io::Printer::Print(this->printer_,"\n");
  return;
}

Assistant:

void Generator::PrintTopLevelExtensions() const {
  const bool is_extension = true;
  for (int i = 0; i < file_->extension_count(); ++i) {
    const FieldDescriptor& extension_field = *file_->extension(i);
    string constant_name = extension_field.name() + "_FIELD_NUMBER";
    UpperString(&constant_name);
    printer_->Print("$constant_name$ = $number$\n",
      "constant_name", constant_name,
      "number", SimpleItoa(extension_field.number()));
    printer_->Print("$name$ = ", "name", extension_field.name());
    PrintFieldDescriptor(extension_field, is_extension);
    printer_->Print("\n");
  }
  printer_->Print("\n");
}